

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_registers.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_546e0c::PpuVram_increase_y_switches_vertical_nametable_for_last_row_Test::
~PpuVram_increase_y_switches_vertical_nametable_for_last_row_Test
          (PpuVram_increase_y_switches_vertical_nametable_for_last_row_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PpuVram, increase_y_switches_vertical_nametable_for_last_row) {
    PpuVram v{0b111'00'11101'00000}; // 0b11101 = 29 (last row)
    v.increase_y();
    EXPECT_EQ(0b000'10'00000'00000, v.value());
    v = PpuVram(0b111'10'11101'00000);
    v.increase_y();
    EXPECT_EQ(0b000'00'00000'00000, v.value());
}